

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.c
# Opt level: O0

char * flatcc_json_parser_match_constant
                 (flatcc_json_parser_t *ctx,char *buf,char *end,int pos,int *more)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  char c;
  char *k;
  char *mark;
  int *more_local;
  int pos_local;
  char *end_local;
  char *buf_local;
  flatcc_json_parser_t *ctx_local;
  
  end_local = buf + pos;
  if ((long)end - (long)buf <= (long)pos) {
    *more = 0;
    return buf;
  }
  if (ctx->unquoted == 0) {
    if (*end_local == 0x20) {
      do {
        end_local = (char *)((byte *)end_local + 1);
        bVar3 = false;
        if (end_local != end) {
          bVar3 = *end_local == 0x20;
        }
      } while (bVar3);
      if (end_local == end) {
        *more = 0;
        return (char *)(byte *)end_local;
      }
      if (*end_local != 0x22) {
        *more = 1;
        return (char *)(byte *)end_local;
      }
    }
    if (*end_local == '\"') {
      ctx_local = (flatcc_json_parser_t *)flatcc_json_parser_space(ctx,end_local + 1,end);
      *more = 0;
    }
    else if (*end_local == '\\') {
      *more = 0;
      ctx_local = (flatcc_json_parser_t *)flatcc_json_parser_set_error(ctx,end_local,end,0x12);
    }
    else {
      *more = 0;
      ctx_local = (flatcc_json_parser_t *)buf;
    }
    return (char *)ctx_local;
  }
  pbVar2 = (byte *)flatcc_json_parser_space(ctx,end_local,end);
  if (pbVar2 == (byte *)end) {
    *more = 0;
    return (char *)pbVar2;
  }
  if (pbVar2 != (byte *)end_local) {
    bVar1 = *pbVar2;
    if ((bVar1 == 0x5f) || (((int)(char)bVar1 & 0x80U) != 0)) {
      *more = 1;
      return (char *)pbVar2;
    }
    if (('`' < (char)(bVar1 | 0x20)) && ((char)(bVar1 | 0x20) < '{')) {
      *more = 1;
      return (char *)pbVar2;
    }
  }
  *more = 0;
  if (*pbVar2 == 0x2c) {
    return (char *)pbVar2;
  }
  if (*pbVar2 == 0x7d) {
    return (char *)pbVar2;
  }
  if (*pbVar2 == 0x5d) {
    return (char *)pbVar2;
  }
  return buf;
}

Assistant:

const char *flatcc_json_parser_match_constant(flatcc_json_parser_t *ctx, const char *buf, const char *end, int pos, int *more)
{
    const char *mark = buf, *k = buf + pos;

    if (end - buf <= pos) {
        *more = 0;
        return buf;
    }
#if FLATCC_JSON_PARSE_ALLOW_UNQUOTED
    if (ctx->unquoted) {
        buf = flatcc_json_parser_space(ctx, k, end);
        if (buf == end) {
            /*
             * We cannot make a decision on more.
             * Just return end and let parser handle sync point in
             * case it is able to resume parse later on.
             * For the same reason we do not lower ctx->unquoted.
             */
            *more = 0;
            return buf;
        }
        if (buf != k) {
            char c = *buf;
            /*
             * Space was seen - and thus we have a valid match.
             * If the next char is an identifier start symbol
             * we raise the more flag to support syntax like:
             *
             *     `flags: Hungry Sleepy Awake, ...`
             */
            if (c == '_' || (c & 0x80)) {
                *more = 1;
                return buf;
            }
            c |= 0x20;
            if (c >= 'a' && c <= 'z') {
                *more = 1;
                return buf;
            }
        }
        /*
         * Space was not seen, so the match is only valid if followed
         * by a JSON separator symbol, and there cannot be more values
         * following so `more` is lowered.
         */
        *more = 0;
        if (*buf == ',' || *buf == '}' || *buf == ']') {
            return buf;
        }
        return mark;
    }
#endif
    buf = k;
    if (*buf == 0x20) {
        ++buf;
        while (buf != end && *buf == 0x20) {
            ++buf;
        }
        if (buf == end) {
            *more = 0;
            return buf;
        }
        /* We accept untrimmed space like "  Green  Blue  ". */
        if (*buf != '\"') {
            *more = 1;
            return buf;
        }
    }
    switch (*buf) {
    case '\\':
        *more = 0;
        return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_invalid_escape);
    case '\"':
        buf = flatcc_json_parser_space(ctx, buf + 1, end);
        *more = 0;
        return buf;
    }
    *more = 0;
    return mark;
}